

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O1

s32 __thiscall
irr::video::CNullDriver::addHighLevelShaderMaterialFromFiles
          (CNullDriver *this,IReadFile *vertexShaderProgram,c8 *vertexShaderEntryPointName,
          E_VERTEX_SHADER_TYPE vsCompileTarget,IReadFile *pixelShaderProgram,
          c8 *pixelShaderEntryPointName,E_PIXEL_SHADER_TYPE psCompileTarget,
          IReadFile *geometryShaderProgram,c8 *geometryShaderEntryPointName,
          E_GEOMETRY_SHADER_TYPE gsCompileTarget,E_PRIMITIVE_TYPE inType,E_PRIMITIVE_TYPE outType,
          u32 verticesOut,IShaderConstantSetCallBack *callback,E_MATERIAL_TYPE baseMaterial,
          s32 userData)

{
  int iVar1;
  undefined4 extraout_var;
  void *pvVar3;
  undefined4 extraout_var_00;
  void *pvVar4;
  undefined4 extraout_var_01;
  void *pvVar5;
  long lVar2;
  
  if (vertexShaderProgram == (IReadFile *)0x0) {
LAB_001cead0:
    pvVar3 = (void *)0x0;
  }
  else {
    iVar1 = (*vertexShaderProgram->_vptr_IReadFile[2])(vertexShaderProgram);
    lVar2 = CONCAT44(extraout_var,iVar1);
    if (lVar2 == 0) goto LAB_001cead0;
    pvVar3 = operator_new__(lVar2 + 1);
    (**vertexShaderProgram->_vptr_IReadFile)(vertexShaderProgram,pvVar3,lVar2);
    *(undefined1 *)((long)pvVar3 + lVar2) = 0;
  }
  if (pixelShaderProgram != (IReadFile *)0x0) {
    iVar1 = (*pixelShaderProgram->_vptr_IReadFile[2])(pixelShaderProgram);
    lVar2 = CONCAT44(extraout_var_00,iVar1);
    if (lVar2 != 0) {
      if (pixelShaderProgram == vertexShaderProgram) {
        (*pixelShaderProgram->_vptr_IReadFile[1])(pixelShaderProgram,0,0);
      }
      pvVar4 = operator_new__(lVar2 + 1);
      (**pixelShaderProgram->_vptr_IReadFile)(pixelShaderProgram,pvVar4,lVar2);
      *(undefined1 *)((long)pvVar4 + lVar2) = 0;
      goto LAB_001ceb26;
    }
  }
  pvVar4 = (void *)0x0;
LAB_001ceb26:
  if (geometryShaderProgram == (IReadFile *)0x0) {
    pvVar5 = (void *)0x0;
  }
  else {
    iVar1 = (*geometryShaderProgram->_vptr_IReadFile[2])(geometryShaderProgram);
    lVar2 = CONCAT44(extraout_var_01,iVar1);
    if (lVar2 == 0) {
      pvVar5 = (void *)0x0;
    }
    else {
      if (geometryShaderProgram == vertexShaderProgram ||
          geometryShaderProgram == pixelShaderProgram) {
        (*geometryShaderProgram->_vptr_IReadFile[1])(geometryShaderProgram,0,0);
      }
      pvVar5 = operator_new__(lVar2 + 1);
      (**geometryShaderProgram->_vptr_IReadFile)(geometryShaderProgram,pvVar5,lVar2);
      *(undefined1 *)((long)pvVar5 + lVar2) = 0;
    }
  }
  iVar1 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x71])
                    (this,pvVar3,vertexShaderEntryPointName,(ulong)vsCompileTarget,pvVar4,
                     pixelShaderEntryPointName,(ulong)psCompileTarget,pvVar5,
                     geometryShaderEntryPointName,(ulong)gsCompileTarget,(ulong)inType,
                     (ulong)outType,(ulong)verticesOut,callback,(ulong)baseMaterial,
                     (ulong)(uint)userData);
  if (pvVar3 != (void *)0x0) {
    operator_delete__(pvVar3);
  }
  if (pvVar4 != (void *)0x0) {
    operator_delete__(pvVar4);
  }
  if (pvVar5 != (void *)0x0) {
    operator_delete__(pvVar5);
  }
  return iVar1;
}

Assistant:

s32 CNullDriver::addHighLevelShaderMaterialFromFiles(
		io::IReadFile *vertexShaderProgram,
		const c8 *vertexShaderEntryPointName,
		E_VERTEX_SHADER_TYPE vsCompileTarget,
		io::IReadFile *pixelShaderProgram,
		const c8 *pixelShaderEntryPointName,
		E_PIXEL_SHADER_TYPE psCompileTarget,
		io::IReadFile *geometryShaderProgram,
		const c8 *geometryShaderEntryPointName,
		E_GEOMETRY_SHADER_TYPE gsCompileTarget,
		scene::E_PRIMITIVE_TYPE inType, scene::E_PRIMITIVE_TYPE outType,
		u32 verticesOut,
		IShaderConstantSetCallBack *callback,
		E_MATERIAL_TYPE baseMaterial,
		s32 userData)
{
	c8 *vs = 0;
	c8 *ps = 0;
	c8 *gs = 0;

	if (vertexShaderProgram) {
		const long size = vertexShaderProgram->getSize();
		if (size) {
			vs = new c8[size + 1];
			vertexShaderProgram->read(vs, size);
			vs[size] = 0;
		}
	}

	if (pixelShaderProgram) {
		const long size = pixelShaderProgram->getSize();
		if (size) {
			// if both handles are the same we must reset the file
			if (pixelShaderProgram == vertexShaderProgram)
				pixelShaderProgram->seek(0);
			ps = new c8[size + 1];
			pixelShaderProgram->read(ps, size);
			ps[size] = 0;
		}
	}

	if (geometryShaderProgram) {
		const long size = geometryShaderProgram->getSize();
		if (size) {
			// if both handles are the same we must reset the file
			if ((geometryShaderProgram == vertexShaderProgram) ||
					(geometryShaderProgram == pixelShaderProgram))
				geometryShaderProgram->seek(0);
			gs = new c8[size + 1];
			geometryShaderProgram->read(gs, size);
			gs[size] = 0;
		}
	}

	s32 result = this->addHighLevelShaderMaterial(
			vs, vertexShaderEntryPointName, vsCompileTarget,
			ps, pixelShaderEntryPointName, psCompileTarget,
			gs, geometryShaderEntryPointName, gsCompileTarget,
			inType, outType, verticesOut,
			callback, baseMaterial, userData);

	delete[] vs;
	delete[] ps;
	delete[] gs;

	return result;
}